

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lritdump.cc
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 extraout_RAX;
  int iVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  string *psVar8;
  bool bVar9;
  char **ppcVar10;
  Options opts;
  stat st;
  Options local_ec;
  allocator local_e9;
  ulong local_e8;
  string local_e0;
  stat local_c0;
  
  local_ec.extract = false;
  local_ec.json = false;
  local_ec.verbose = false;
  local_e8._0_1_ = 0;
  local_e8._1_7_ = 0;
  bVar6 = false;
  bVar9 = false;
  do {
    while( true ) {
      do {
        iVar7 = argc;
        uVar3 = getopt_long(argc,argv,"xjv",main::longOpts,0);
        iVar5 = (int)uVar3;
      } while (iVar5 == 0);
      if (iVar5 < 0x76) break;
      if (iVar5 == 0x76) {
        bVar9 = true;
      }
      else {
        if (iVar5 != 0x78) {
          if (iVar5 == 0x1337) {
            local_ec.json = (bool)(undefined1)local_e8;
            local_ec.extract = bVar6;
            local_ec.verbose = bVar9;
            usage(iVar7,argv);
          }
LAB_001123c4:
          local_ec.json = (bool)(undefined1)local_e8;
          local_ec.extract = bVar6;
          local_ec.verbose = bVar9;
          exit(1);
        }
        bVar6 = true;
      }
    }
    if (iVar5 == -1) {
      local_ec.json = (bool)(undefined1)local_e8;
      local_ec.extract = bVar6;
      if (argc <= _optind) {
        return 0;
      }
      ppcVar10 = argv + _optind;
      iVar5 = argc - _optind;
      iVar7 = 0;
      local_ec.verbose = bVar9;
      break;
    }
    if (iVar5 != 0x6a) goto LAB_001123c4;
    local_e8._1_7_ = (undefined7)((ulong)uVar3 >> 8);
    local_e8._0_1_ = 1;
  } while( true );
LAB_0011228e:
  iVar1 = stat(*ppcVar10,&local_c0);
  if (iVar1 < 0) {
    main_cold_1();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  if (bVar6 == false) {
    if ((local_e8 & 1) == 0) {
      std::__cxx11::string::string((string *)&local_e0,*ppcVar10,&local_e9);
      iVar2 = dump(&local_ec,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      iVar4 = 1;
      iVar1 = 1;
      if (iVar2 == 0) goto LAB_00112373;
    }
    else {
      psVar8 = &local_e0;
      std::__cxx11::string::string((string *)&local_e0,*ppcVar10,&local_e9);
      json((Options *)psVar8,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      iVar4 = 7;
      iVar1 = iVar7;
    }
  }
  else {
    psVar8 = &local_e0;
    std::__cxx11::string::string((string *)&local_e0,*ppcVar10,&local_e9);
    extract((Options *)psVar8,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
LAB_00112373:
    iVar4 = 0;
    iVar1 = iVar7;
  }
  if ((iVar4 != 7) && (iVar4 != 0)) {
    return iVar1;
  }
  ppcVar10 = ppcVar10 + 1;
  iVar5 = iVar5 + -1;
  iVar7 = iVar1;
  if (iVar5 == 0) {
    return 0;
  }
  goto LAB_0011228e;
}

Assistant:

int main(int argc, char** argv) {
  Options opts;

  while (1) {
    static struct option longOpts[] = {
      {"extract", no_argument, nullptr, 'x'},
      {"json",    no_argument, nullptr, 'j'},
      {"verbose", no_argument, nullptr, 'v'},
      {"help",    no_argument, nullptr, 0x1337},
      {nullptr,   0,           nullptr, 0},
    };

    auto c = getopt_long(argc, argv, "xjv", longOpts, nullptr);
    if (c == -1) {
      break;
    }

    switch (c) {
    case 0:
      break;
    case 'x':
      opts.extract = true;
      break;
    case 'j':
      opts.json = true;
      break;
    case 'v':
      opts.verbose = true;
      break;
    case 0x1337:
      usage(argc, argv);
      break;
    default:
      exit(1);
    }
  }

  for (auto i = optind; i < argc; i++) {
    struct stat st;
    auto rv = stat(argv[i], &st);
    if (rv < 0) {
      fprintf(stderr, "%s: %s\n", argv[i], strerror(errno));
      exit(1);
    }
    if (opts.extract) {
      rv = extract(opts, argv[i]);
      if (rv != 0) {
        return rv;
      }
    } else {
      if (opts.json) {
        rv = json(opts, argv[i]);
        if (rv != 0) {
          return rv;
        }
        continue;
      }
      rv = dump(opts, argv[i]);
      if (rv != 0) {
        return rv;
      }
    }
  }

  return 0;
}